

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::pwd(void)

{
  char *pcVar1;
  size_t sVar2;
  runtime_error *this;
  Path *in_RDI;
  char cwd [4096];
  string local_1068;
  string local_1048;
  char local_1028 [4104];
  
  pcVar1 = getcwd(local_1028,0x1000);
  if (pcVar1 != (char *)0x0) {
    local_1068._M_dataplus._M_p = (pointer)&local_1068.field_2;
    sVar2 = strlen(local_1028);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1068,local_1028,local_1028 + sVar2);
    filename_to_utf8(&local_1048,&local_1068);
    Path(in_RDI,&local_1048);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
      operator_delete(local_1048._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068._M_dataplus._M_p != &local_1068.field_2) {
      operator_delete(local_1068._M_dataplus._M_p);
    }
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1068._M_dataplus._M_p = (pointer)&local_1068.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1068,"Failed to retrieve current working directory.","");
  std::runtime_error::runtime_error(this,(string *)&local_1068);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Path Path::pwd()
{
#if defined(_PATHIE_UNIX)
  char cwd[PATH_MAX];
  if (getcwd(cwd, PATH_MAX) != NULL)
    return Path(filename_to_utf8(cwd));
  else
    throw(std::runtime_error("Failed to retrieve current working directory."));
#elif defined(_WIN32)
  wchar_t cwd[MAX_PATH];
  if (GetCurrentDirectoryW(MAX_PATH, cwd) == 0)
    throw(std::runtime_error("Failed to retrieve current working directory."));
  else
    return Path(utf16_to_utf8(std::wstring(cwd)));
#else
#error Unsupported platform.
#endif
}